

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_1_channels_with_n_coeffs_mod0
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __m128 c;
  __m128 tot;
  float *local_180;
  float *hc;
  float *pfStack_170;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_150;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  
  decode = output_buffer;
  pfStack_150 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfStack_170 = decode_buffer + (int)*horizontal_coefficients_local;
    hc._4_4_ = (int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local >> 2;
    local_180 = pfStack_150;
    local_98 = (float)*(undefined8 *)pfStack_150;
    fStack_94 = (float)((ulong)*(undefined8 *)pfStack_150 >> 0x20);
    fStack_90 = (float)*(undefined8 *)(pfStack_150 + 2);
    fStack_8c = (float)((ulong)*(undefined8 *)(pfStack_150 + 2) >> 0x20);
    local_a8 = (float)*(undefined8 *)pfStack_170;
    fStack_a4 = (float)((ulong)*(undefined8 *)pfStack_170 >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(pfStack_170 + 2);
    fStack_9c = (float)((ulong)*(undefined8 *)(pfStack_170 + 2) >> 0x20);
    c[2] = local_98 * local_a8;
    c[3] = fStack_94 * fStack_a4;
    tot[0] = fStack_90 * fStack_a0;
    tot[1] = fStack_8c * fStack_9c;
    do {
      uVar1 = *(undefined8 *)(local_180 + 4);
      uVar2 = *(undefined8 *)(pfStack_170 + 4);
      local_b8 = (float)uVar1;
      fStack_b4 = (float)((ulong)uVar1 >> 0x20);
      fStack_b0 = (float)*(undefined8 *)(local_180 + 6);
      fStack_ac = (float)((ulong)*(undefined8 *)(local_180 + 6) >> 0x20);
      local_c8 = (float)uVar2;
      fStack_c4 = (float)((ulong)uVar2 >> 0x20);
      fStack_c0 = (float)*(undefined8 *)(pfStack_170 + 6);
      fStack_bc = (float)((ulong)*(undefined8 *)(pfStack_170 + 6) >> 0x20);
      c[2] = c[2] + local_b8 * local_c8;
      c[3] = c[3] + fStack_b4 * fStack_c4;
      tot[0] = tot[0] + fStack_b0 * fStack_c0;
      tot[1] = tot[1] + fStack_ac * fStack_bc;
      hc._4_4_ = hc._4_4_ + -1;
      local_180 = local_180 + 4;
      pfStack_170 = pfStack_170 + 4;
    } while (0 < hc._4_4_);
    *decode = c[2] + tot[0] + c[3] + tot[1];
    pfStack_150 = pfStack_150 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 1;
  } while (decode < output_buffer + output_sub_size);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod0 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 4 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__store_output();
  } while ( output < output_end );
}